

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::log_assert(ConsoleReporter *this,AssertData *rb)

{
  char *success_str;
  
  if (((rb->m_failed != false) || (this->opt->success == true)) && (this->tc->m_no_output == false))
  {
    std::mutex::lock(&this->mutex);
    logTestStart(this);
    success_str = " ";
    (*(this->super_IReporter)._vptr_IReporter[0xe])(this,rb->m_file,(ulong)(uint)rb->m_line);
    successOrFailColoredStringToStream(this,(bool)(rb->m_failed ^ 1),rb->m_at,success_str);
    fulltext_log_assert_to_stream(this->s,rb);
    log_contexts(this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if((!rb.m_failed && !opt.success) || tc->m_no_output)
                return;

            DOCTEST_LOCK_MUTEX(mutex)

            logTestStart();

            file_line_to_stream(rb.m_file, rb.m_line, " ");
            successOrFailColoredStringToStream(!rb.m_failed, rb.m_at);

            fulltext_log_assert_to_stream(s, rb);

            log_contexts();
        }